

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

const_reference __thiscall
immutable::transient_vector<int,_false,_6>::back(transient_vector<int,_false,_6> *this)

{
  int *piVar1;
  transient_vector<int,_false,_6> *this_local;
  
  piVar1 = transient_rrb_peek<int,false,6>(&this->_impl);
  return piVar1;
}

Assistant:

const_reference back() const
        {
        return transient_rrb_peek(_impl);
        }